

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O3

size_t t3vsprintf(char *buf,size_t buflen,char *fmt,__va_list_tag *args0)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  void *pvVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  uint *puVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  undefined8 uVar13;
  size_t sVar14;
  byte bVar15;
  int iVar16;
  char *__s;
  char *pcVar17;
  size_t sVar18;
  byte *pbVar19;
  byte *pbVar20;
  va_list args;
  char buf_1 [20];
  uint local_78;
  uint *puStack_70;
  byte local_58 [24];
  ulong local_40;
  ulong local_38;
  
  pvVar4 = args0->reg_save_area;
  local_78 = args0->gp_offset;
  puStack_70 = (uint *)args0->overflow_arg_area;
  sVar14 = 0;
  do {
    __s = (char *)local_58;
    bVar1 = *fmt;
    if (bVar1 == 0x25) {
      bVar1 = ((byte *)fmt)[1];
      lVar7 = 1;
      bVar15 = bVar1;
      if (bVar1 == 0x7e) {
        bVar15 = ((byte *)fmt)[2];
        lVar7 = 2;
      }
      pbVar19 = (byte *)fmt + (ulong)(bVar15 == 0x2b) + lVar7;
      bVar2 = ((byte *)fmt)[(ulong)(bVar15 == 0x2b) + lVar7];
      bVar3 = bVar2;
      if (bVar2 == 0x2d) {
        pbVar20 = pbVar19 + 1;
        pbVar19 = pbVar19 + 1;
        bVar3 = *pbVar20;
      }
      if ((int)(char)bVar3 - 0x3aU < 0xfffffff6) {
        local_40 = 0xffffffff;
        if (bVar3 == 0x2a) {
          uVar8 = (ulong)local_78;
          if (uVar8 < 0x29) {
            local_78 = local_78 + 8;
            puVar9 = (uint *)(uVar8 + (long)pvVar4);
          }
          else {
            puVar9 = puStack_70;
            puStack_70 = puStack_70 + 2;
          }
          local_40 = (ulong)*puVar9;
          uVar6 = (uint)pbVar19[1];
          pbVar19 = pbVar19 + 1;
        }
        else {
          uVar6 = (uint)bVar3;
        }
      }
      else {
        uVar10 = (int)(char)bVar3 - 0x30;
        local_40 = 0;
        do {
          local_40 = (ulong)(uVar10 + (int)local_40 * 10);
          uVar6 = (uint)(char)pbVar19[1];
          pbVar19 = pbVar19 + 1;
          uVar10 = uVar6 - 0x30;
        } while (uVar10 < 10);
      }
      sVar18 = 0xffffffff;
      if ((char)uVar6 == '.') {
        uVar6 = (uint)(char)pbVar19[1];
        if (uVar6 == 0x2a) {
          uVar8 = (ulong)local_78;
          if (uVar8 < 0x29) {
            local_78 = local_78 + 8;
            puVar9 = (uint *)(uVar8 + (long)pvVar4);
          }
          else {
            puVar9 = puStack_70;
            puStack_70 = puStack_70 + 2;
          }
          sVar18 = (size_t)*puVar9;
          uVar6 = (uint)pbVar19[2];
          pbVar19 = pbVar19 + 2;
        }
        else {
          sVar18 = 0;
          while( true ) {
            pbVar19 = pbVar19 + 1;
            if (9 < uVar6 - 0x30) break;
            sVar18 = (size_t)((uVar6 - 0x30) + (int)sVar18 * 10);
            uVar6 = (uint)(char)pbVar19[1];
          }
        }
      }
      uVar6 = uVar6 & 0xff;
      uVar8 = 1;
      bVar5 = false;
      iVar16 = (int)sVar18;
      if (uVar6 < 100) {
        if (uVar6 == 0x25) {
          __s = "%";
LAB_001f3757:
          pbVar20 = (byte *)0x2b7db5;
LAB_001f3be9:
          iVar16 = (int)local_40;
          sVar18 = 0;
          do {
            if (1 < buflen) {
              buflen = buflen - 1;
              *buf = ((byte *)__s)[sVar18];
              buf = (char *)((byte *)buf + 1);
            }
            sVar18 = sVar18 + 1;
          } while (uVar8 != sVar18);
          sVar14 = sVar14 + uVar8;
        }
        else {
          if (uVar6 != 0x50) {
            if (uVar6 != 99) goto switchD_001f3696_caseD_70;
            uVar11 = (ulong)local_78;
            if (uVar11 < 0x29) {
              local_78 = local_78 + 8;
              puVar9 = (uint *)(uVar11 + (long)pvVar4);
            }
            else {
              puVar9 = puStack_70;
              puStack_70 = puStack_70 + 2;
            }
            local_58[0] = (byte)*puVar9;
            goto LAB_001f3757;
          }
          uVar8 = (ulong)local_78;
          if (uVar8 < 0x29) {
            local_78 = local_78 + 8;
            puVar9 = (uint *)(uVar8 + (long)pvVar4);
          }
          else {
            puVar9 = puStack_70;
            puStack_70 = puStack_70 + 2;
          }
          pbVar20 = *(byte **)puVar9;
          if (pbVar20 == (byte *)0x0) {
            pbVar20 = (byte *)0x2b7db5;
          }
          if (iVar16 < 0) {
            sVar18 = strlen((char *)pbVar20);
          }
          iVar16 = (int)local_40;
          uVar8 = local_40;
          for (; sVar18 != 0; sVar18 = sVar18 - 1) {
            uVar10 = *pbVar20 - 0x20;
            if ((uVar10 < 0x3e) && ((0x28000001ac009fdbU >> ((ulong)uVar10 & 0x3f) & 1) != 0)) {
              sprintf((char *)local_58,"%%%02x");
              lVar7 = 0;
              do {
                if (1 < buflen) {
                  *buf = local_58[lVar7];
                  buf = (char *)((byte *)buf + 1);
                  buflen = buflen - 1;
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 != 3);
              sVar14 = sVar14 + 3;
              uVar8 = local_40;
            }
            else {
              sVar14 = sVar14 + 1;
              if (1 < buflen) {
                *buf = *pbVar20;
                buf = (char *)((byte *)buf + 1);
                buflen = buflen - 1;
              }
            }
            iVar16 = (int)uVar8;
            pbVar20 = pbVar20 + 1;
          }
          bVar5 = false;
          uVar8 = 0;
          pbVar20 = (byte *)0x2b7db5;
        }
      }
      else {
        switch(uVar6) {
        case 0x6f:
          uVar8 = (ulong)local_78;
          if (uVar8 < 0x29) {
            local_78 = local_78 + 8;
            puVar9 = (uint *)(uVar8 + (long)pvVar4);
          }
          else {
            puVar9 = puStack_70;
            puStack_70 = puStack_70 + 2;
          }
          uVar8 = (ulong)*puVar9;
          pcVar17 = "%o";
          break;
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x74:
        case 0x76:
        case 0x77:
switchD_001f3696_caseD_70:
          __s = "%";
          pbVar20 = (byte *)0x2b7db5;
          pbVar19 = (byte *)fmt;
          goto LAB_001f3be9;
        case 0x73:
          uVar8 = (ulong)local_78;
          if (uVar8 < 0x29) {
            local_78 = local_78 + 8;
            puVar9 = (uint *)(uVar8 + (long)pvVar4);
          }
          else {
            puVar9 = puStack_70;
            puStack_70 = puStack_70 + 2;
          }
          __s = *(char **)puVar9;
          if ((byte *)__s == (byte *)0x0) {
            __s = "(null)";
          }
          if (*__s == 0) {
            uVar8 = 0;
          }
          else {
            uVar11 = 0;
            do {
              uVar8 = uVar11;
              if ((ulong)(long)iVar16 <= uVar11 && iVar16 != -1) break;
              uVar8 = uVar11 + 1;
              lVar7 = uVar11 + 1;
              uVar11 = uVar8;
            } while (((byte *)__s)[lVar7] != 0);
          }
          bVar5 = false;
          iVar16 = (int)local_40;
          if (bVar1 == 0x7e) {
            iVar12 = iVar16 + -3;
            if (0xffffffc1 < iVar16 - 0x3dU) {
              iVar12 = 0x3c;
            }
            uVar11 = (ulong)iVar12;
            bVar5 = uVar11 < uVar8;
            if (uVar11 <= uVar8) {
              uVar8 = uVar11;
            }
          }
          if (((bVar2 != 0x2d) && (iVar16 != -1)) && (uVar11 = (ulong)iVar16, uVar8 < uVar11)) {
            do {
              if (1 < buflen) {
                buflen = buflen - 1;
                *buf = 0x20;
                buf = (char *)((byte *)buf + 1);
              }
              uVar11 = uVar11 - 1;
              sVar14 = sVar14 + 1;
            } while (uVar8 < uVar11);
            pbVar20 = (byte *)0x2b7db5;
            goto LAB_001f3bd1;
          }
          pbVar20 = (byte *)0x2b7db5;
          goto LAB_001f3bdd;
        case 0x75:
          uVar8 = (ulong)local_78;
          if (uVar8 < 0x29) {
            local_78 = local_78 + 8;
            puVar9 = (uint *)(uVar8 + (long)pvVar4);
          }
          else {
            puVar9 = puStack_70;
            puStack_70 = puStack_70 + 2;
          }
          uVar8 = (ulong)*puVar9;
          pcVar17 = "%u";
          break;
        case 0x78:
          uVar8 = (ulong)local_78;
          if (uVar8 < 0x29) {
            local_78 = local_78 + 8;
            puVar9 = (uint *)(uVar8 + (long)pvVar4);
          }
          else {
            puVar9 = puStack_70;
            puStack_70 = puStack_70 + 2;
          }
          uVar8 = (ulong)*puVar9;
          pcVar17 = "%x";
          break;
        default:
          if (uVar6 != 100) {
            if (uVar6 != 0x6c) goto switchD_001f3696_caseD_70;
            bVar1 = pbVar19[1];
            pbVar19 = pbVar19 + 1;
            if (bVar1 < 0x75) {
              if (bVar1 == 100) {
                uVar8 = (ulong)local_78;
                if (uVar8 < 0x29) {
                  local_78 = local_78 + 8;
                  puVar9 = (uint *)(uVar8 + (long)pvVar4);
                }
                else {
                  puVar9 = puStack_70;
                  puStack_70 = puStack_70 + 2;
                }
                uVar13 = *(undefined8 *)puVar9;
                pcVar17 = "%ld";
              }
              else {
                if (bVar1 != 0x6f) goto switchD_001f3696_caseD_70;
                uVar8 = (ulong)local_78;
                if (uVar8 < 0x29) {
                  local_78 = local_78 + 8;
                  puVar9 = (uint *)(uVar8 + (long)pvVar4);
                }
                else {
                  puVar9 = puStack_70;
                  puStack_70 = puStack_70 + 2;
                }
                uVar13 = *(undefined8 *)puVar9;
                pcVar17 = "%lo";
              }
            }
            else if (bVar1 == 0x75) {
              uVar8 = (ulong)local_78;
              if (uVar8 < 0x29) {
                local_78 = local_78 + 8;
                puVar9 = (uint *)(uVar8 + (long)pvVar4);
              }
              else {
                puVar9 = puStack_70;
                puStack_70 = puStack_70 + 2;
              }
              uVar13 = *(undefined8 *)puVar9;
              pcVar17 = "%lu";
            }
            else {
              if (bVar1 != 0x78) goto switchD_001f3696_caseD_70;
              uVar8 = (ulong)local_78;
              if (uVar8 < 0x29) {
                local_78 = local_78 + 8;
                puVar9 = (uint *)(uVar8 + (long)pvVar4);
              }
              else {
                puVar9 = puStack_70;
                puStack_70 = puStack_70 + 2;
              }
              uVar13 = *(undefined8 *)puVar9;
              pcVar17 = "%lx";
            }
            sprintf(__s,pcVar17,uVar13);
            goto LAB_001f396d;
          }
          uVar8 = (ulong)local_78;
          if (uVar8 < 0x29) {
            local_78 = local_78 + 8;
            puVar9 = (uint *)(uVar8 + (long)pvVar4);
          }
          else {
            puVar9 = puStack_70;
            puStack_70 = puStack_70 + 2;
          }
          local_38 = (ulong)*puVar9;
          sprintf(__s,"%d");
          if (pbVar19[1] == 0x74) {
            if (pbVar19[2] != 0x68) goto LAB_001f396d;
            pbVar19 = pbVar19 + 2;
            if ((int)local_38 % 100 - 0x15U < 0xfffffff5) {
              iVar16 = (int)local_38 % 10;
              if (iVar16 == 3) {
                pbVar20 = (byte *)0x2c2e2b;
              }
              else if (iVar16 == 2) {
                pbVar20 = (byte *)0x2b9b14;
              }
              else {
                if (iVar16 != 1) goto LAB_001f3cdd;
                pbVar20 = (byte *)0x2bbb86;
              }
            }
            else {
LAB_001f3cdd:
              pbVar20 = (byte *)0x2c2ffa;
            }
          }
          else {
            pbVar20 = (byte *)0x2b7db5;
          }
          goto LAB_001f3974;
        }
        sprintf(__s,pcVar17,uVar8);
LAB_001f396d:
        pbVar20 = (byte *)0x2b7db5;
LAB_001f3974:
        uVar8 = strlen((char *)local_58);
        bVar5 = false;
        if (bVar2 == 0x2d) {
          __s = (char *)local_58;
        }
        else {
          if ((int)local_40 != -1) {
            uVar11 = (ulong)(int)local_40;
            __s = (char *)local_58;
            if (uVar8 < uVar11) {
              if (local_58[0] == 0x2d || bVar15 != 0x2b) {
LAB_001f39e8:
                if ((bVar3 == 0x30) && (local_58[0] == 0x2d)) {
                  if (1 < buflen) {
                    buflen = buflen - 1;
                    *buf = 0x2d;
                    buf = (char *)((byte *)buf + 1);
                  }
                  sVar14 = sVar14 + 1;
                  uVar8 = uVar8 - 1;
                  __s = (char *)(local_58 + 1);
                }
              }
              else {
                sVar14 = sVar14 + 1;
                if (1 < buflen) {
                  buflen = buflen - 1;
                  *buf = 0x2b;
                  buf = (char *)((byte *)buf + 1);
                  goto LAB_001f39e8;
                }
              }
              if (uVar8 < uVar11) {
                do {
                  if (1 < buflen) {
                    buflen = buflen - 1;
                    *buf = (bVar3 == 0x30) << 4 | 0x20;
                    buf = (char *)((byte *)buf + 1);
                  }
                  uVar11 = uVar11 - 1;
                  sVar14 = sVar14 + 1;
                } while (uVar8 < uVar11);
LAB_001f3bd1:
                local_40 = uVar11 & 0xffffffff;
              }
              goto LAB_001f3bdd;
            }
          }
          __s = (char *)local_58;
        }
LAB_001f3bdd:
        iVar16 = (int)local_40;
        if (uVar8 != 0) goto LAB_001f3be9;
        uVar8 = 0;
      }
      bVar1 = *pbVar20;
      while (bVar1 != 0) {
        pbVar20 = pbVar20 + 1;
        if (1 < buflen) {
          buflen = buflen - 1;
          *buf = bVar1;
          buf = (char *)((byte *)buf + 1);
        }
        sVar14 = sVar14 + 1;
        bVar1 = *pbVar20;
      }
      if (bVar5) {
        lVar7 = -3;
        do {
          if (1 < buflen) {
            buflen = buflen - 1;
            *buf = 0x2e;
            buf = (char *)((byte *)buf + 1);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0);
        sVar14 = sVar14 + 3;
        uVar8 = uVar8 + 3;
      }
      fmt = (char *)pbVar19;
      if (((bVar2 == 0x2d) && (iVar16 != -1)) && (uVar11 = (ulong)iVar16, uVar8 < uVar11)) {
        lVar7 = sVar14 + uVar11;
        do {
          if (1 < buflen) {
            buflen = buflen - 1;
            *buf = 0x20;
            buf = (char *)((byte *)buf + 1);
          }
          uVar11 = uVar11 - 1;
        } while (uVar8 < uVar11);
        sVar14 = lVar7 - uVar8;
      }
    }
    else {
      if (bVar1 == 0) {
        if (buflen != 0) {
          *buf = 0;
        }
        return sVar14;
      }
      sVar14 = sVar14 + 1;
      if (1 < buflen) {
        buflen = buflen - 1;
        *buf = bVar1;
        buf = (char *)((byte *)buf + 1);
      }
    }
    fmt = (char *)((byte *)fmt + 1);
  } while( true );
}

Assistant:

size_t t3vsprintf(char *buf, size_t buflen, const char *fmt, va_list args0)
{
    size_t rem;
    size_t need = 0;
    char *dst;

    /* 
     *   make a private copy of the arguments, to ensure that we don't modify
     *   the caller's copy (on some platforms, va_list is a reference type;
     *   the caller might want to reuse their argument pointer for a two-pass
     *   operation, such as a pre-format pass to measure how much space is
     *   needed) 
     */
    va_list args;
    os_va_copy(args, args0);

    /* scan the buffer */
    for (dst = buf, rem = buflen ; *fmt != '\0' ; ++fmt)
    {
        /* check for a format specifier */
        if (*fmt == '%')
        {
            const char *fmt_start = fmt;
            const char *nth = "";
            const char *txt;
            size_t txtlen;
            char buf[20];
            int fld_wid = -1;
            int fld_prec = -1;
            char lead_char = ' ';
            int plus = FALSE;
            int approx = FALSE;
            int add_ellipsis = FALSE;
            int left_align = FALSE;
            size_t i;

            /* skip the '%' */
            ++fmt;

            /* check for the "approximation" flag */
            if (*fmt == '~')
            {
                approx = TRUE;
                ++fmt;
            }

            /* check for an explicit sign */
            if (*fmt == '+')
            {
                plus = TRUE;
                ++fmt;
            }

            /* check for left alignment */
            if (*fmt == '-')
            {
                left_align = TRUE;
                ++fmt;
            }

            /* if leading zeros are desired, note it */
            if (*fmt == '0')
                lead_char = '0';

            /* check for a field width specifier */
            if (is_digit(*fmt))
            {
                /* scan the digits */
                for (fld_wid = 0 ; is_digit(*fmt) ; ++fmt)
                {
                    fld_wid *= 10;
                    fld_wid += value_of_digit(*fmt);
                }
            }
            else if (*fmt == '*')
            {
                /* the value is an integer taken from the arguments */
                fld_wid = va_arg(args, int);

                /* skip the '*' */
                ++fmt;
            }

            /* check for a precision specifier */
            if (*fmt == '.')
            {
                /* skip the '.' */
                ++fmt;

                /* check what we have */
                if (*fmt == '*')
                {
                    /* the value is an integer taken from the arguments */
                    fld_prec = va_arg(args, int);

                    /* skip the '*' */
                    ++fmt;
                }
                else
                {
                    /* scan the digits */
                    for (fld_prec = 0 ; is_digit(*fmt) ; ++fmt)
                    {
                        fld_prec *= 10;
                        fld_prec += value_of_digit(*fmt);
                    }
                }
            }
            
            /* check what follows */
            switch (*fmt)
            {
            case '%':
                /* it's a literal '%' */
                txt = "%";
                txtlen = 1;
                break;

            case 's':
                /* the value is a (char *) */
                txt = va_arg(args, char *);

                /* if it's null, show "(null)" */
                if (txt == 0)
                    txt = "(null)";

                /* get the length, limiting it to the precision */
                {
                    const char *p;

                    /* 
                     *   Scan until we reach a null terminator, or until our
                     *   length reaches the maximum given by the precision
                     *   qualifier.  
                     */
                    for (txtlen = 0, p = txt ;
                         *p != '\0' && (fld_prec == -1
                                        || txtlen < (size_t)fld_prec) ;
                         ++p, ++txtlen) ;
                }

                /* 
                 *   if the 'approximation' flag is specified, limit the
                 *   string to 60 characters or the field width, whichever
                 *   is less 
                 */
                if (approx)
                {
                    size_t lim;
                    
                    /* the default limit is 60 characters */
                    lim = 60;

                    /* 
                     *   if a field width is specified, it overrides the
                     *   default - but take out three characters for the
                     *   '...' suffix 
                     */
                    if (fld_wid != -1 && (size_t)fld_wid > lim)
                        lim = fld_wid - 3;

                    /* if we're over the limit, shorten the string */
                    if (txtlen > lim)
                    {
                        /* shorten the string to the limit */
                        txtlen = lim;

                        /* add an ellipsis to indicate the truncation */
                        add_ellipsis = TRUE;
                    }
                }

                /* 
                 *   if a field width was specified and we have the default
                 *   right alignment, pad to the left with spaces if the
                 *   width is greater than the actual length 
                 */
                if (fld_wid != -1 && !left_align)
                {
                    for ( ; (size_t)fld_wid > txtlen ; --fld_wid)
                    {
                        ++need;
                        if (rem > 1)
                            --rem, *dst++ = ' ';
                    }
                }
                break;

            case 'P':
                /* 
                 *   URL parameter - this is a (char*) value with url
                 *   encoding applied 
                 */
                txt = va_arg(args, char *);

                /* if it's null, use an empty string */
                if (txt == 0)
                    txt = "";

                /* use the field precision if given, or the string length */
                txtlen = (fld_prec >= 0 ? fld_prec : strlen(txt));

                /* encode the parameter and add it to the buffer */
                for ( ; txtlen != 0 ; --txtlen, ++txt)
                {
                    switch (*txt)
                    {
                    case '!':
                    case '*':
                    case '\'':
                    case '(':
                    case ')':
                    case ';':
                    case ':':
                    case '@':
                    case '&':
                    case '=':
                    case '+':
                    case '$':
                    case ',':
                    case '/':
                    case '?':
                    case '#':
                    case '[':
                    case ']':
                    case ' ':
                        /* use % encoding for special characters */
                        sprintf(buf, "%%%02x", (unsigned)(uchar)*txt);
                        need += 3;
                        for (i = 0 ; i < 3 ; ++i)
                        {
                            if (rem > 1)
                                *dst++ = buf[i], --rem;
                        }
                        break;

                    default:
                        /* copy anything else as-is */
                        need += 1;
                        if (rem > 1)
                            *dst++ = *txt, --rem;
                        break;
                    }
                }
                break;

            case 'c':
                /* the value is a (char) */
                buf[0] = (char)va_arg(args, int);
                txt = buf;
                txtlen = 1;
                break;

            case 'd':
                /* the value is an int, formatted in decimal */
                {
                    int ival = va_arg(args, int);
                    sprintf(buf, "%d", ival);

                    /* check for '%dth' notation (1st, 2nd, etc) */
                    nth = check_nth(fmt, ival);
                }
                /* fall through to num_common: */
                
            num_common:
                /* use the temporary buffer where we formatted the value */
                txt = buf;
                txtlen = strlen(buf);

                /* 
                 *   Pad with leading spaces or zeros if the requested
                 *   field width exceeds the actual size and we have the
                 *   default left alignment.  
                 */
                if (fld_wid != -1 && !left_align && (size_t)fld_wid > txtlen)
                {
                    /* 
                     *   if we're showing an explicit sign, and we don't have
                     *   a leading '-' in the results, add it 
                     */
                    if (plus && txt[0] != '-')
                    {
                        /* add the '+' at the start of the output */
                        ++need;
                        if (rem > 1)
                            --rem, *dst++ = '+';
                    }

                    /* 
                     *   if we're showing leading zeros, and we have a
                     *   negative number, show the '-' first 
                     */
                    if (lead_char == '0' && txt[0] == '-')
                    {
                        /* add the '-' at the start of the output */
                        ++need;
                        if (rem > 1)
                            --rem, *dst++ = '-';
                        
                        /* we've shown the '-', so skip it in the number */
                        ++txt;
                        --txtlen;
                    }

                    /* add the padding */
                    for ( ; (size_t)fld_wid > txtlen ; --fld_wid)
                    {
                        ++need;
                        if (rem > 1)
                            --rem, *dst++ = lead_char;
                    }
                }

                /* done */
                break;

            case 'u':
                /* the value is an int, formatted as unsigned decimal */
                sprintf(buf, "%u", va_arg(args, int));
                goto num_common;

            case 'x':
                /* the value is an int, formatted in hex */
                sprintf(buf, "%x", va_arg(args, int));
                goto num_common;

            case 'o':
                /* the value is an int, formatted in hex */
                sprintf(buf, "%o", va_arg(args, int));
                goto num_common;

            case 'l':
                /* it's a 'long' value - get the second specifier */
                switch (*++fmt)
                {
                case 'd':
                    /* it's a long, formatted in decimal */
                    sprintf(buf, "%ld", va_arg(args, long));
                    goto num_common;

                case 'u':
                    /* it's a long, formatted as unsigned decimal */
                    sprintf(buf, "%lu", va_arg(args, long));
                    goto num_common;

                case 'x':
                    /* it's a long, formatted in hex */
                    sprintf(buf, "%lx", va_arg(args, long));
                    goto num_common;

                case 'o':
                    /* it's a long, formatted in octal */
                    sprintf(buf, "%lo", va_arg(args, long));
                    goto num_common;

                default:
                    /* bad specifier - show the literal text */
                    txt = "%";
                    txtlen = 1;
                    fmt = fmt_start;
                    break;
                }
                break;

            default:
                /* bad specifier - show the literal text */
                txt = "%";
                txtlen = 1;
                fmt = fmt_start;
                break;
            }

            /* add the text to the buffer */
            for (i = txtlen ; i != 0 ; --i, ++txt)
            {
                ++need;
                if (rem > 1)
                    --rem, *dst++ = *txt;
            }

            /* add the 'nth' suffix, if applicable */
            for ( ; *nth != 0 ; ++nth)
            {
                ++need;
                if (rem > 1)
                    --rem, *dst++ = *nth;
            }

            /* add an ellipsis if desired */
            if (add_ellipsis)
            {
                /* add three '.' characters */
                for (i = 3 ; i != 0 ; --i)
                {
                    ++need;
                    if (rem > 1)
                        --rem, *dst++ = '.';
                }

                /* for padding purposes, count the ellipsis */
                txtlen += 3;
            }

            /* 
             *   if we have left alignment and the actual length is less
             *   than the field width, pad to the right with spaces 
             */
            if (left_align && fld_wid != -1 && (size_t)fld_wid > txtlen)
            {
                /* add spaces to pad out to the field width */
                for (i = fld_wid ; i > txtlen ; --i)
                {
                    ++need;
                    if (rem > 1)
                        --rem, *dst++ = ' ';
                }
            }
        }
        else
        {
            /* it's not a format specifier - just copy it literally */
            ++need;
            if (rem > 1)
                --rem, *dst++ = *fmt;
        }
    }

    /* add the trailing null */
    if (rem != 0)
        *dst = '\0';

    /* bracket the va_copy at the top of the function */
    os_va_copy_end(args);

    /* return the needed length */
    return need;
}